

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory,
          mode_t *default_dir_mode)

{
  cmCPackLog *pcVar1;
  pointer pcVar2;
  char cVar3;
  _Alloc_hider _Var4;
  undefined8 msg;
  pointer pRVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar11;
  undefined8 *puVar12;
  pointer pbVar13;
  ulong *puVar14;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  undefined1 extraout_DL_06;
  undefined1 extraout_DL_07;
  undefined1 extraout_DL_08;
  undefined1 collapse;
  int iVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined8 uVar17;
  string *filename;
  pointer ppVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  pointer this_00;
  bool bVar19;
  byte bVar20;
  string inFileRelative;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  string destDir;
  string filePath;
  string top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  ostringstream cmCPackLog_msg;
  string subdir;
  Glob gl;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  string findExpr;
  string local_398;
  undefined1 local_378 [32];
  int local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  string local_310;
  pointer local_2f0;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  pointer local_288;
  string *local_280;
  undefined1 local_278 [112];
  ios_base local_208 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [81];
  bool local_8f;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  pointer local_40;
  mode_t *local_38;
  
  local_88.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_start = (RegularExpression *)0x0;
  local_88.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (RegularExpression *)0x0;
  local_88.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._0_8_ = local_278 + 0x10;
  local_280 = tempInstallDirectory;
  local_38 = default_dir_mode;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CPACK_IGNORE_FILES","");
  pcVar8 = GetOption(this,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (pcVar8 != (char *)0x0) {
    local_378._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_378._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_378._16_8_ = (pointer)0x0;
    local_278._0_8_ = local_278 + 0x10;
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,pcVar8,pcVar8 + sVar9);
    cmSystemTools::ExpandListArgument
              ((string *)local_278,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_378,false);
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    uVar17 = local_378._8_8_;
    if (local_378._0_8_ != local_378._8_8_) {
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378._0_8_;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Create ignore files regex for: ",0x1f);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(__args->_M_dataplus)._M_p,
                             __args->_M_string_length);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        msg = local_e0._0_8_;
        sVar9 = strlen((char *)local_e0._0_8_);
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x13e,(char *)msg,sVar9);
        if ((GlobInternals *)local_e0._0_8_ != (GlobInternals *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                   &local_88,__args);
        __args = __args + 1;
      } while (__args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar17
              );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_378);
  }
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"CPACK_INSTALLED_DIRECTORIES","");
  pcVar8 = GetOption(this,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_278._0_8_ = local_278 + 0x10;
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,pcVar8,pcVar8 + sVar9);
    cmSystemTools::ExpandListArgument((string *)local_278,&local_2c8,false);
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if (((int)local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                 ,0xac);
      std::ios::widen((char)(ostream *)local_278 + (char)*(ulong *)(local_278._0_8_ + -0x18));
      std::ostream::put((char)local_278);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar17 = local_e0._0_8_;
      sVar9 = strlen((char *)local_e0._0_8_);
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x14e,(char *)uVar17,sVar9);
      if ((GlobInternals *)local_e0._0_8_ != (GlobInternals *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      std::ios_base::~ios_base(local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8);
      iVar15 = 0;
      goto LAB_0014c058;
    }
    bVar19 = local_2c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_2c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar19) {
      local_48 = &this->files;
      pbVar13 = local_2c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2a8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288 = pbVar13;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Find files",10);
        cVar3 = (char)(string *)local_278;
        std::ios::widen((char)*(ulong *)(local_278._0_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar17 = local_e0._0_8_;
        sVar9 = strlen((char *)local_e0._0_8_);
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x156,(char *)uVar17,sVar9);
        if ((GlobInternals *)local_e0._0_8_ != (GlobInternals *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        cmsys::Glob::Glob((Glob *)local_e0);
        pbVar13 = local_288;
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        pcVar2 = (local_288->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e8,pcVar2,pcVar2 + local_288->_M_string_length);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        pcVar2 = pbVar13[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,pcVar2,pcVar2 + pbVar13[1]._M_string_length);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_2e8._M_dataplus._M_p,
                   local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
        std::__cxx11::string::append((char *)&local_68);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"- Install directory: ",0x15);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,local_2e8._M_dataplus._M_p,
                             local_2e8._M_string_length);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar17 = local_378._0_8_;
        sVar9 = strlen((char *)local_378._0_8_);
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x15e,(char *)uVar17,sVar9);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_378 + 0x10))
        {
          operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        local_e0[8] = true;
        local_8f = true;
        bVar6 = cmsys::Glob::FindFiles((Glob *)local_e0,&local_68,(GlobMessages *)0x0);
        if (bVar6) {
          __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(local_48,__x);
          pbVar13 = (this->files).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_2f0 = (this->files).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          collapse = extraout_DL;
          if (pbVar13 != local_2f0) {
            do {
              local_378._0_8_ = local_378 + 0x10;
              pcVar2 = (pbVar13->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_378,pcVar2,pcVar2 + pbVar13->_M_string_length);
              bVar6 = cmsys::SystemTools::FileIsDirectory(pbVar13);
              if (bVar6) {
                std::__cxx11::string::push_back((char)local_378);
              }
              pRVar5 = local_88.
                       super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (local_88.
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_88.
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0014b02e:
                paVar16 = &local_398.field_2;
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                pcVar2 = (local_280->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_330,pcVar2,pcVar2 + local_280->_M_string_length);
                std::operator+(&local_350,"/",&local_100);
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_350);
                puVar14 = (ulong *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar14) {
                  local_398.field_2._M_allocated_capacity = *puVar14;
                  local_398.field_2._8_8_ = plVar11[3];
                  local_398._M_dataplus._M_p = (pointer)paVar16;
                }
                else {
                  local_398.field_2._M_allocated_capacity = *puVar14;
                  local_398._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_398._M_string_length = plVar11[1];
                *plVar11 = (long)puVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                cmSystemTools::RelativePath(&local_310,&local_2e8,pbVar13);
                uVar17 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != paVar16) {
                  uVar17 = local_398.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar17 < local_310._M_string_length + local_398._M_string_length) {
                  uVar17 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != &local_310.field_2) {
                    uVar17 = local_310.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar17 < local_310._M_string_length + local_398._M_string_length)
                  goto LAB_0014b129;
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_310,0,(char *)0x0,
                                       (ulong)local_398._M_dataplus._M_p);
                }
                else {
LAB_0014b129:
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_398,(ulong)local_310._M_dataplus._M_p);
                }
                local_278._0_8_ = local_278 + 0x10;
                puVar14 = puVar12 + 2;
                if ((ulong *)*puVar12 == puVar14) {
                  local_278._16_8_ = *puVar14;
                  local_278._24_8_ = puVar12[3];
                }
                else {
                  local_278._16_8_ = *puVar14;
                  local_278._0_8_ = (ulong *)*puVar12;
                }
                local_278._8_8_ = puVar12[1];
                *puVar12 = puVar14;
                puVar12[1] = 0;
                *(undefined1 *)puVar14 = 0;
                std::__cxx11::string::_M_append((char *)&local_330,local_278._0_8_);
                if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                  operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != &local_310.field_2) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != paVar16) {
                  operator_delete(local_398._M_dataplus._M_p,
                                  local_398.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_278,"Copy file: ",0xb);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_278,(char *)local_378._0_8_,local_378._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," -> ",4);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,local_330._M_dataplus._M_p,local_330._M_string_length);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                pcVar1 = this->Logger;
                std::__cxx11::stringbuf::str();
                _Var4._M_p = local_398._M_dataplus._M_p;
                sVar9 = strlen(local_398._M_dataplus._M_p);
                cmCPackLog::Log(pcVar1,4,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x17c,_Var4._M_p,sVar9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != paVar16) {
                  operator_delete(local_398._M_dataplus._M_p,
                                  local_398.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                std::ios_base::~ios_base(local_208);
                bVar6 = cmsys::SystemTools::FileIsSymlink((string *)local_378);
                if (bVar6) {
                  local_278._0_8_ = local_278 + 0x10;
                  local_278._8_8_ = 0;
                  local_278._16_8_ = local_278._16_8_ & 0xffffffffffffff00;
                  cmSystemTools::RelativePath(&local_398,&local_2e8,(string *)local_378);
                  cmsys::SystemTools::ReadSymlink((string *)local_378,(string *)local_278);
                  std::
                  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  ::emplace_back<std::__cxx11::string,std::__cxx11::string>
                            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                              *)&local_2a8,(string *)local_278,&local_398);
                  collapse = extraout_DL_02;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != paVar16) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                    collapse = extraout_DL_03;
                  }
                  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
                    collapse = extraout_DL_04;
                  }
                  iVar15 = 0;
                }
                else {
                  bVar6 = cmsys::SystemTools::CopyFileIfDifferent((string *)local_378,&local_330);
                  if (bVar6) {
                    bVar6 = cmFileTimes::Copy((string *)local_378,&local_330);
                    iVar15 = 0;
                    collapse = extraout_DL_05;
                    if (bVar6) goto LAB_0014b520;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,"Problem copying file: ",0x16);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_278,(char *)local_378._0_8_,local_378._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," -> ",4);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,local_330._M_dataplus._M_p,local_330._M_string_length
                                      );
                  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  pcVar1 = this->Logger;
                  std::__cxx11::stringbuf::str();
                  _Var4._M_p = local_398._M_dataplus._M_p;
                  sVar9 = strlen(local_398._M_dataplus._M_p);
                  cmCPackLog::Log(pcVar1,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x18b,_Var4._M_p,sVar9);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != paVar16) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                  std::ios_base::~ios_base(local_208);
                  iVar15 = 1;
                  collapse = extraout_DL_06;
                }
LAB_0014b520:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                  collapse = extraout_DL_07;
                }
              }
              else {
                bVar6 = false;
                this_00 = local_88.
                          super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  bVar7 = cmsys::RegularExpression::find
                                    (this_00,(char *)local_378._0_8_,&this_00->regmatch);
                  collapse = extraout_DL_00;
                  if (bVar7) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,"Ignore file: ",0xd);
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_278,(char *)local_378._0_8_,
                                         local_378._8_8_);
                    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                    std::ostream::put((char)poVar10);
                    std::ostream::flush();
                    pcVar1 = this->Logger;
                    std::__cxx11::stringbuf::str();
                    _Var4._M_p = local_330._M_dataplus._M_p;
                    sVar9 = strlen(local_330._M_dataplus._M_p);
                    cmCPackLog::Log(pcVar1,2,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                    ,0x171,_Var4._M_p,sVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p != &local_330.field_2) {
                      operator_delete(local_330._M_dataplus._M_p,
                                      local_330.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                    std::ios_base::~ios_base(local_208);
                    bVar6 = true;
                    collapse = extraout_DL_01;
                  }
                  this_00 = this_00 + 1;
                } while (this_00 != pRVar5);
                iVar15 = 0x12;
                if (!bVar6) goto LAB_0014b02e;
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_378._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                collapse = extraout_DL_08;
              }
              if ((iVar15 != 0x12) && (iVar15 != 0)) goto LAB_0014b57e;
              pbVar13 = pbVar13 + 1;
            } while (pbVar13 != local_2f0);
          }
          iVar15 = 0x11;
LAB_0014b57e:
          if (iVar15 == 0x11) {
            if (local_2a8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_2a8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                        (&local_330,(SystemTools *)0x1,(bool)collapse);
              pcVar2 = (local_280->_M_dataplus)._M_p;
              local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_398,pcVar2,pcVar2 + local_280->_M_string_length);
              std::operator+((string *)local_278,"/",&local_100);
              std::__cxx11::string::_M_append((char *)&local_398,local_278._0_8_);
              if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
                operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,"Change dir to: ",0xf);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_278,local_398._M_dataplus._M_p,
                                   local_398._M_string_length);
              std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              pcVar1 = this->Logger;
              std::__cxx11::stringbuf::str();
              uVar17 = local_378._0_8_;
              sVar9 = strlen((char *)local_378._0_8_);
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x195,(char *)uVar17,sVar9);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_378._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
              std::ios_base::~ios_base(local_208);
              cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_378,&local_398);
              if (local_358 == 0) {
                iVar15 = 0x1f;
                local_40 = local_2a8.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                bVar20 = local_2a8.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         local_2a8.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (!(bool)bVar20) {
                  local_2f0 = (pointer)CONCAT71(local_2f0._1_7_,bVar20);
                  filename = &(local_2a8.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->second;
                  do {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,"Will create a symlink: ",0x17);
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_278,(filename->_M_dataplus)._M_p,
                                         filename->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--> ",4);
                    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar10,filename[-1]._M_dataplus._M_p,
                                         filename[-1]._M_string_length);
                    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                    std::ostream::put((char)poVar10);
                    std::ostream::flush();
                    pcVar1 = this->Logger;
                    std::__cxx11::stringbuf::str();
                    _Var4._M_p = local_350._M_dataplus._M_p;
                    sVar9 = strlen(local_350._M_dataplus._M_p);
                    cmCPackLog::Log(pcVar1,4,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                    ,0x1a3,_Var4._M_p,sVar9);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_350._M_dataplus._M_p != &local_350.field_2) {
                      operator_delete(local_350._M_dataplus._M_p,
                                      local_350.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                    std::ios_base::~ios_base(local_208);
                    cmsys::SystemTools::GetFilenamePath(&local_350,filename);
                    if ((local_350._M_string_length != 0) &&
                       (bVar6 = cmsys::SystemTools::MakeDirectory(&local_350,local_38), !bVar6)) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_278,"Cannot create dir: ",0x13);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_278,local_350._M_dataplus._M_p,
                                           local_350._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,"\nTrying to create symlink: ",0x1b);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar10,(filename->_M_dataplus)._M_p,
                                           filename->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--> ",4);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar10,filename[-1]._M_dataplus._M_p,
                                           filename[-1]._M_string_length);
                      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      pcVar1 = this->Logger;
                      std::__cxx11::stringbuf::str();
                      _Var4._M_p = local_310._M_dataplus._M_p;
                      sVar9 = strlen(local_310._M_dataplus._M_p);
                      cmCPackLog::Log(pcVar1,0x10,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                      ,0x1ad,_Var4._M_p,sVar9);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_310._M_dataplus._M_p != &local_310.field_2) {
                        operator_delete(local_310._M_dataplus._M_p,
                                        local_310.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                      std::ios_base::~ios_base(local_208);
                    }
                    bVar6 = cmSystemTools::CreateSymlink(filename + -1,filename,(string *)0x0);
                    if (bVar6) {
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_350._M_dataplus._M_p != &local_350.field_2) {
                        operator_delete(local_350._M_dataplus._M_p,
                                        local_350.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_278,"Cannot create symlink: ",0x17);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_278,(filename->_M_dataplus)._M_p,
                                           filename->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--> ",4);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar10,filename[-1]._M_dataplus._M_p,
                                           filename[-1]._M_string_length);
                      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      pcVar1 = this->Logger;
                      std::__cxx11::stringbuf::str();
                      _Var4._M_p = local_310._M_dataplus._M_p;
                      sVar9 = strlen(local_310._M_dataplus._M_p);
                      cmCPackLog::Log(pcVar1,0x10,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                      ,0x1b4,_Var4._M_p,sVar9);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_310._M_dataplus._M_p != &local_310.field_2) {
                        operator_delete(local_310._M_dataplus._M_p,
                                        local_310.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                      std::ios_base::~ios_base(local_208);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_350._M_dataplus._M_p != &local_350.field_2) {
                        operator_delete(local_350._M_dataplus._M_p,
                                        local_350.field_2._M_allocated_capacity + 1);
                      }
                      if (!bVar6) {
                        iVar15 = 1;
                        break;
                      }
                    }
                    ppVar18 = (pointer)(filename + 1);
                    local_2f0 = (pointer)CONCAT71(local_2f0._1_7_,ppVar18 == local_40);
                    filename = filename + 2;
                  } while (ppVar18 != local_40);
                  bVar20 = (byte)local_2f0;
                }
                if ((bVar20 & 1) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,"Going back to: ",0xf);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_278,local_330._M_dataplus._M_p,
                                       local_330._M_string_length);
                  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  pcVar1 = this->Logger;
                  std::__cxx11::stringbuf::str();
                  _Var4._M_p = local_350._M_dataplus._M_p;
                  sVar9 = strlen(local_350._M_dataplus._M_p);
                  cmCPackLog::Log(pcVar1,4,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x1b9,_Var4._M_p,sVar9);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p != &local_350.field_2) {
                    operator_delete(local_350._M_dataplus._M_p,
                                    local_350.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                  std::ios_base::~ios_base(local_208);
                  iVar15 = 0;
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_278,"Failed to change working directory to ",0x26);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_278,local_398._M_dataplus._M_p,
                                     local_398._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," : ",3);
                pcVar8 = strerror(local_358);
                if (pcVar8 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar9 = strlen(pcVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
                }
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                pcVar1 = this->Logger;
                std::__cxx11::stringbuf::str();
                _Var4._M_p = local_350._M_dataplus._M_p;
                sVar9 = strlen(local_350._M_dataplus._M_p);
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x19c,_Var4._M_p,sVar9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
                std::ios_base::~ios_base(local_208);
                iVar15 = 1;
              }
              cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_378);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if (iVar15 != 0) goto LAB_0014be9d;
            }
            iVar15 = 0;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"Cannot find any files in the installed directory",0x30);
          std::ios::widen((char)*(ulong *)(local_278._0_8_ + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          uVar17 = local_378._0_8_;
          sVar9 = strlen((char *)local_378._0_8_);
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x164,(char *)uVar17,sVar9);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10)) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
          std::ios_base::~ios_base(local_208);
          iVar15 = 1;
        }
LAB_0014be9d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        cmsys::Glob::~Glob((Glob *)local_e0);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_2a8);
        if (iVar15 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2c8);
          iVar15 = 0;
          if (!bVar19) goto LAB_0014c058;
          goto LAB_0014bf58;
        }
        pbVar13 = local_288 + 2;
        bVar19 = pbVar13 ==
                 local_2c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (!bVar19);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8);
  }
LAB_0014bf58:
  iVar15 = 1;
LAB_0014c058:
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&local_88);
  return iVar15;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory,
  const mode_t* default_dir_mode)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if (cpackIgnoreFiles) {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    for (std::string const& ifr : ignoreFilesRegexString) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Create ignore files regex for: " << ifr << std::endl);
      ignoreFilesRegex.emplace_back(ifr);
    }
  }
  const char* installDirectories =
    this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if (installDirectories && *installDirectories) {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
                                      installDirectoriesVector);
    if (installDirectoriesVector.size() % 2 != 0) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation."
          << std::endl);
      return 0;
    }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for (it = installDirectoriesVector.begin();
         it != installDirectoriesVector.end(); ++it) {
      std::vector<std::pair<std::string, std::string>> symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if (!gl.FindFiles(findExpr)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot find any files in the installed directory"
                        << std::endl);
        return 0;
      }
      files = gl.GetFiles();
      for (std::string const& gf : files) {
        bool skip = false;
        std::string inFile = gf;
        if (cmSystemTools::FileIsDirectory(gf)) {
          inFile += '/';
        }
        for (cmsys::RegularExpression& reg : ignoreFilesRegex) {
          if (reg.find(inFile)) {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                          "Ignore file: " << inFile << std::endl);
            skip = true;
          }
        }
        if (skip) {
          continue;
        }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/" + cmSystemTools::RelativePath(top, gf);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Copy file: " << inFile << " -> " << filePath
                                    << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if (cmSystemTools::FileIsSymlink(inFile)) {
          std::string targetFile;
          std::string inFileRelative =
            cmSystemTools::RelativePath(top, inFile);
          cmSystemTools::ReadSymlink(inFile, targetFile);
          symlinkedFiles.emplace_back(std::move(targetFile),
                                      std::move(inFileRelative));
        }
        /* If it is not a symlink then do a plain copy */
        else if (!(cmSystemTools::CopyFileIfDifferent(inFile, filePath) &&
                   cmFileTimes::Copy(inFile, filePath))) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Problem copying file: " << inFile << " -> "
                                                 << filePath << std::endl);
          return 0;
        }
      }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty()) {
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir += "/" + subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir << std::endl);
        cmWorkingDirectory workdir(goToDir);
        if (workdir.Failed()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Failed to change working directory to "
                          << goToDir << " : "
                          << std::strerror(workdir.GetLastResult())
                          << std::endl);
          return 0;
        }
        for (auto const& symlinked : symlinkedFiles) {
          cmCPackLogger(cmCPackLog::LOG_DEBUG,
                        "Will create a symlink: " << symlinked.second << "--> "
                                                  << symlinked.first
                                                  << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinked.second);
          if (!destDir.empty() &&
              !cmSystemTools::MakeDirectory(destDir, default_dir_mode)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create dir: "
                            << destDir << "\nTrying to create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
          }
          if (!cmSystemTools::CreateSymlink(symlinked.first,
                                            symlinked.second)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
            return 0;
          }
        }
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Going back to: " << curDir << std::endl);
      }
    }
  }
  return 1;
}